

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_model(Net *this,DataReader *dr)

{
  undefined1 uVar2;
  Layer *pLVar1;
  undefined3 uVar3;
  int iVar4;
  int iVar5;
  pointer ppLVar6;
  ulong uVar7;
  Net *this_00;
  ModelBinFromDataReader mb;
  Option opt1;
  ModelBinFromDataReader MStack_68;
  undefined4 local_58;
  int iStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  if ((this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    load_model();
    iVar4 = -1;
  }
  else {
    ModelBinFromDataReader::ModelBinFromDataReader(&MStack_68,dr);
    ppLVar6 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppLVar6) {
      uVar7 = 0;
      do {
        pLVar1 = ppLVar6[uVar7];
        if ((pLVar1 == (Layer *)0x0) ||
           (iVar4 = (*pLVar1->_vptr_Layer[3])(pLVar1,&MStack_68), iVar4 != 0)) {
          load_model();
          iVar4 = -1;
          goto LAB_0012d7a0;
        }
        uVar7 = uVar7 + 1;
        ppLVar6 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar7 < (ulong)((long)(this->layers).
                                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar6 >> 3
                              ));
    }
    iVar4 = 0;
LAB_0012d7a0:
    ppLVar6 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppLVar6) {
      this_00 = (Net *)0x0;
      do {
        pLVar1 = ppLVar6[(long)this_00];
        if (pLVar1 == (Layer *)0x0) {
          load_model(this_00);
LAB_0012d858:
          iVar4 = -1;
          break;
        }
        local_38._0_1_ = (this->opt).use_int8_arithmetic;
        local_38._1_1_ = (this->opt).use_packing_layout;
        local_38._2_1_ = (this->opt).use_shader_pack8;
        local_38._3_1_ = (this->opt).use_image_storage;
        uVar2 = (this->opt).use_bf16_storage;
        uVar3 = *(undefined3 *)&(this->opt).field_0x25;
        local_38._4_4_ = CONCAT31(uVar3,uVar2);
        local_58 = *(undefined4 *)&this->opt;
        iStack_54 = (this->opt).num_threads;
        uStack_50 = *(undefined4 *)&(this->opt).blob_allocator;
        uStack_4c = *(undefined4 *)((long)&(this->opt).blob_allocator + 4);
        local_48 = *(undefined4 *)&(this->opt).workspace_allocator;
        uStack_44 = *(undefined4 *)((long)&(this->opt).workspace_allocator + 4);
        uStack_40._0_1_ = (this->opt).use_winograd_convolution;
        uStack_40._1_1_ = (this->opt).use_sgemm_convolution;
        uStack_40._2_1_ = (this->opt).use_int8_inference;
        uStack_40._3_1_ = (this->opt).use_vulkan_compute;
        uStack_3c._0_1_ = (this->opt).use_fp16_packed;
        uStack_3c._1_1_ = (this->opt).use_fp16_storage;
        uStack_3c._2_1_ = (this->opt).use_fp16_arithmetic;
        uStack_3c._3_1_ = (this->opt).use_int8_storage;
        if (pLVar1->support_image_storage == false) {
          local_38._0_4_ = (uint)(uint3)local_38;
        }
        iVar5 = (*pLVar1->_vptr_Layer[4])(pLVar1,&local_58);
        if (iVar5 != 0) {
          load_model(this_00);
          goto LAB_0012d858;
        }
        this_00 = (Net *)&(this_00->opt).field_0x1;
        ppLVar6 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (this_00 < (undefined1 *)
                         ((long)(this->layers).
                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar6 >> 3));
    }
    ModelBin::~ModelBin(&MStack_68.super_ModelBin);
  }
  return iVar4;
}

Assistant:

Layer* Net::create_custom_layer(int index)
{
    const size_t custom_layer_registry_entry_count = custom_layer_registry.size();
    if (index < 0 || static_cast<unsigned int>(index) >= custom_layer_registry_entry_count)
        return 0;

    layer_creator_func layer_creator = custom_layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    return layer_creator();
}